

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SchemaClear(void *p)

{
  HashElem *pHVar1;
  long lVar2;
  long in_FS_OFFSET;
  Hash local_378;
  Hash local_358;
  sqlite3 local_340;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (long)&local_358 + 8;
  pHVar1 = (HashElem *)&local_378.first;
  memset(&local_340,0,0x310);
  local_358._0_8_ = *(undefined8 *)((long)p + 8);
  local_358.first = *(HashElem **)((long)p + 0x10);
  local_358.ht = *(_ht **)((long)p + 0x18);
  local_378.ht = *(_ht **)((long)p + 0x48);
  local_378._0_8_ = *(undefined8 *)((long)p + 0x38);
  local_378.first = *(HashElem **)((long)p + 0x40);
  *(undefined8 *)((long)p + 0x38) = 0;
  *(undefined8 *)((long)p + 0x40) = 0;
  *(undefined8 *)((long)p + 0x48) = 0;
  sqlite3HashClear((Hash *)((long)p + 0x20));
  while (pHVar1 = pHVar1->next, pHVar1 != (HashElem *)0x0) {
    sqlite3DeleteTrigger(&local_340,(Trigger *)pHVar1->data);
  }
  sqlite3HashClear(&local_378);
  *(undefined8 *)((long)p + 8) = 0;
  *(undefined8 *)((long)p + 0x10) = 0;
  *(undefined8 *)((long)p + 0x18) = 0;
  while (lVar2 = *(long *)lVar2, lVar2 != 0) {
    sqlite3DeleteTable(&local_340,*(Table **)(lVar2 + 0x10));
  }
  sqlite3HashClear(&local_358);
  sqlite3HashClear((Hash *)((long)p + 0x50));
  *(undefined8 *)((long)p + 0x68) = 0;
  if ((*(ushort *)((long)p + 0x72) & 1) != 0) {
    *(int *)((long)p + 4) = *(int *)((long)p + 4) + 1;
  }
  *(ushort *)((long)p + 0x72) = *(ushort *)((long)p + 0x72) & 0xfff6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3SchemaClear(void *p){
  Hash temp1;
  Hash temp2;
  HashElem *pElem;
  Schema *pSchema = (Schema *)p;
  sqlite3 xdb;

  memset(&xdb, 0, sizeof(xdb));
  temp1 = pSchema->tblHash;
  temp2 = pSchema->trigHash;
  sqlite3HashInit(&pSchema->trigHash);
  sqlite3HashClear(&pSchema->idxHash);
  for(pElem=sqliteHashFirst(&temp2); pElem; pElem=sqliteHashNext(pElem)){
    sqlite3DeleteTrigger(&xdb, (Trigger*)sqliteHashData(pElem));
  }
  sqlite3HashClear(&temp2);
  sqlite3HashInit(&pSchema->tblHash);
  for(pElem=sqliteHashFirst(&temp1); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    sqlite3DeleteTable(&xdb, pTab);
  }
  sqlite3HashClear(&temp1);
  sqlite3HashClear(&pSchema->fkeyHash);
  pSchema->pSeqTab = 0;
  if( pSchema->schemaFlags & DB_SchemaLoaded ){
    pSchema->iGeneration++;
  }
  pSchema->schemaFlags &= ~(DB_SchemaLoaded|DB_ResetWanted);
}